

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateChangePerfTestCases.cpp
# Opt level: O2

void __thiscall
deqp::gls::StateChangePerformanceCase::callDraw(StateChangePerformanceCase *this,Functions *gl)

{
  DrawType DVar1;
  
  DVar1 = this->m_drawType;
  if (DVar1 == DRAWTYPE_INDEXED_BUFFER) {
    (*gl->drawElements)(4,this->m_triangleCount * 3,0x1403,(void *)0x0);
    return;
  }
  if (DVar1 != DRAWTYPE_INDEXED_USER_PTR) {
    if (DVar1 == DRAWTYPE_NOT_INDEXED) {
      (*gl->drawArrays)(4,0,this->m_triangleCount * 3);
      return;
    }
    return;
  }
  (*gl->drawElements)(4,this->m_triangleCount * 3,0x1403,
                      (this->m_indices).
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_start);
  return;
}

Assistant:

void StateChangePerformanceCase::callDraw (const glw::Functions& gl)
{
	switch (m_drawType)
	{
		case DRAWTYPE_NOT_INDEXED:		gl.drawArrays(GL_TRIANGLES, 0, m_triangleCount * 3);									break;
		case DRAWTYPE_INDEXED_USER_PTR:	gl.drawElements(GL_TRIANGLES, m_triangleCount * 3, GL_UNSIGNED_SHORT, &m_indices[0]);	break;
		case DRAWTYPE_INDEXED_BUFFER:	gl.drawElements(GL_TRIANGLES, m_triangleCount * 3, GL_UNSIGNED_SHORT, NULL);			break;
		default:
			DE_ASSERT(false);
	}
}